

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O0

void sapp_set_icon(sapp_icon_desc *desc)

{
  _Bool _Var1;
  wchar_t num_images_00;
  sapp_icon_desc *psStack_10;
  int num_images;
  sapp_icon_desc *desc_local;
  
  if (desc == (sapp_icon_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_app.h"
                  ,0x2f4b,"void sapp_set_icon(const sapp_icon_desc *)");
  }
  psStack_10 = desc;
  if ((desc->sokol_default & 1U) != 0) {
    if (_sapp.default_icon_pixels == (uint32_t *)0x0) {
      _sapp_setup_default_icon();
    }
    if (_sapp.default_icon_pixels == (uint32_t *)0x0) {
      __assert_fail("0 != _sapp.default_icon_pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_app.h"
                    ,0x2f50,"void sapp_set_icon(const sapp_icon_desc *)");
    }
    psStack_10 = &_sapp.default_icon_desc;
  }
  num_images_00 = _sapp_icon_num_images(psStack_10);
  if (num_images_00 != L'\0') {
    if ((num_images_00 < L'\x01') || (L'\b' < num_images_00)) {
      __assert_fail("(num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_app.h"
                    ,0x2f57,"void sapp_set_icon(const sapp_icon_desc *)");
    }
    _Var1 = _sapp_validate_icon_desc(psStack_10,num_images_00);
    if (_Var1) {
      _sapp_x11_set_icon(psStack_10,num_images_00);
    }
  }
  return;
}

Assistant:

SOKOL_API_IMPL void sapp_set_icon(const sapp_icon_desc* desc) {
    SOKOL_ASSERT(desc);
    if (desc->sokol_default) {
        if (0 == _sapp.default_icon_pixels) {
            _sapp_setup_default_icon();
        }
        SOKOL_ASSERT(0 != _sapp.default_icon_pixels);
        desc = &_sapp.default_icon_desc;
    }
    const int num_images = _sapp_icon_num_images(desc);
    if (num_images == 0) {
        return;
    }
    SOKOL_ASSERT((num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES));
    if (!_sapp_validate_icon_desc(desc, num_images)) {
        return;
    }
    #if defined(_SAPP_MACOS)
        _sapp_macos_set_icon(desc, num_images);
    #elif defined(_SAPP_WIN32)
        _sapp_win32_set_icon(desc, num_images);
    #elif defined(_SAPP_LINUX)
        _sapp_x11_set_icon(desc, num_images);
    #elif defined(_SAPP_EMSCRIPTEN)
        _sapp_emsc_set_icon(desc, num_images);
    #endif
}